

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::QueryBufferStorageTestCase::execute
          (QueryBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  GLenum GVar1;
  deUint32 dVar2;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  MessageBuilder local_1c0;
  ulong *local_40;
  GLint64 *result_ptr;
  uint local_24;
  byte local_1d;
  uint n_getter_call;
  bool should_commit_page;
  uint n_iteration;
  bool result;
  QueryBufferStorageTestCase *pQStack_10;
  GLuint sparse_bo_storage_flags_local;
  QueryBufferStorageTestCase *this_local;
  
  should_commit_page = true;
  n_iteration = sparse_bo_storage_flags;
  pQStack_10 = this;
  (*this->m_gl->bindBuffer)(0x8f36,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x117d);
  (*this->m_gl->useProgram)(this->m_po);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1180);
  for (n_getter_call = 0; n_getter_call < 2; n_getter_call = n_getter_call + 1) {
    local_1d = n_getter_call == 0;
    (*this->m_gl->bufferPageCommitmentARB)(0x9192,0,(ulong)this->m_sparse_bo_size_rounded,local_1d);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x118e);
    (*this->m_gl->beginQuery)(0x8c87,this->m_qo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBeginQuery() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1192);
    (*this->m_gl->drawArrays)(4,0,this->m_n_triangles * 3);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1196);
    (*this->m_gl->endQuery)(0x8c87);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glEndQuery() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1199);
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      switch(local_24) {
      case 0:
        (*this->m_gl->getQueryObjectiv)(this->m_qo,0x8866,(GLint *)0x0);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glGetQueryObjectiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11a3);
        break;
      case 1:
        (*this->m_gl->getQueryObjectuiv)(this->m_qo,0x8866,(GLuint *)0x0);
        dVar2 = (*this->m_gl->getError)();
        glu::checkError(dVar2,"glGetQueryObjectuiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11ab);
        break;
      case 2:
        (*this->m_gl->getQueryObjecti64v)(this->m_qo,0x8866,(GLint64 *)0x0);
        dVar2 = (*this->m_gl->getError)();
        glu::checkError(dVar2,"glGetQueryObjecti64v() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11b3);
        break;
      case 3:
        (*this->m_gl->getQueryObjectui64v)(this->m_qo,0x8866,(GLuint64 *)0x0);
        dVar2 = (*this->m_gl->getError)();
        glu::checkError(dVar2,"glGetQueryObjectui64v() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11bb);
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid getter call type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                   ,0x11c2);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if ((local_1d & 1) != 0) {
        local_40 = (ulong *)0x0;
        (*this->m_gl->bindBuffer)(0x8f37,this->m_helper_bo);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11cc);
        (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,4);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glCopyBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11d1);
        local_40 = (ulong *)(*this->m_gl->mapBuffer)(0x8f37,35000);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glMapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11d5);
        if (*local_40 != (ulong)this->m_n_triangles) {
          this_01 = tcu::TestContext::getLog(this->m_testCtx);
          tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar3 = tcu::MessageBuilder::operator<<
                             (&local_1c0,
                              (char (*) [59])
                              "Invalid query result stored in a sparse buffer. Expected:[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(long *)local_40);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])"], expected:[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_n_triangles);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1c0);
          should_commit_page = false;
        }
        (*this->m_gl->unmapBuffer)(0x8f37);
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11e5);
        (*this->m_gl->clearBufferData)(0x8f37,0x8229,0x1903,0x1401,"");
        GVar1 = (*this->m_gl->getError)();
        glu::checkError(GVar1,"glClearBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x11e8);
      }
    }
  }
  return (bool)(should_commit_page & 1);
}

Assistant:

bool QueryBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	static const unsigned char data_r8_zero = 0;
	bool					   result		= true;

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Run two separate iterations:
	 *
	 * a) The page holding the query result value is committed.
	 * b) The page is not committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{
		const bool should_commit_page = (n_iteration == 0);

		/* Set up the memory page commitment */
		m_gl.bufferPageCommitmentARB(GL_QUERY_BUFFER, 0, /* offset */
									 m_sparse_bo_size_rounded, should_commit_page ? GL_TRUE : GL_FALSE);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		/* Run the draw call */
		m_gl.beginQuery(GL_PRIMITIVES_GENERATED, m_qo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginQuery() call failed.");

		m_gl.drawArrays(GL_TRIANGLES, 0, /* first */
						m_n_triangles * 3);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		m_gl.endQuery(GL_PRIMITIVES_GENERATED);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndQuery() call failed.");

		/* Copy the query result to the sparse buffer */
		for (unsigned int n_getter_call = 0; n_getter_call < 4; ++n_getter_call)
		{
			switch (n_getter_call)
			{
			case 0:
			{
				m_gl.getQueryObjectiv(m_qo, GL_QUERY_RESULT, (glw::GLint*)0); /* params */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectiv() call failed.");

				break;
			}

			case 1:
			{
				m_gl.getQueryObjectuiv(m_qo, GL_QUERY_RESULT, (glw::GLuint*)0); /* params */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectuiv() call failed.");

				break;
			}

			case 2:
			{
				m_gl.getQueryObjecti64v(m_qo, GL_QUERY_RESULT, (glw::GLint64*)0);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjecti64v() call failed.");

				break;
			}

			case 3:
			{
				m_gl.getQueryObjectui64v(m_qo, GL_QUERY_RESULT, (glw::GLuint64*)0);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetQueryObjectui64v() call failed.");

				break;
			}

			default:
			{
				TCU_FAIL("Invalid getter call type");
			}
			} /* switch (n_getter_call) */

			/* Verify the query result */
			if (should_commit_page)
			{
				const glw::GLint64* result_ptr = NULL;

				m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_helper_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
									   0,											 /* writeOffset */
									   sizeof(unsigned int));
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

				result_ptr = (const glw::GLint64*)m_gl.mapBuffer(GL_COPY_WRITE_BUFFER, GL_READ_ONLY);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

				if (*result_ptr != m_n_triangles)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid query result stored in a sparse buffer. Expected:"
										  "["
									   << *result_ptr << "]"
														 ", expected:"
														 "["
									   << m_n_triangles << "]" << tcu::TestLog::EndMessage;

					result = false;
				}

				m_gl.unmapBuffer(GL_COPY_WRITE_BUFFER);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &data_r8_zero);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			} /* for (all query getter call types) */
		}	 /* if (should_commit_page) */
	}		  /* for (both iterations) */

	return result;
}